

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O0

void __thiscall mraa::Iio::Iio(Iio *this,int device)

{
  mraa_iio_context p_Var1;
  ostream *poVar2;
  invalid_argument *this_00;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  int device_local;
  Iio *this_local;
  
  p_Var1 = (mraa_iio_context)mraa_iio_init(device);
  this->m_iio = p_Var1;
  if (this->m_iio == (mraa_iio_context)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"IIO device ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,device);
    std::operator<<(poVar2," is not valid");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

Iio(int device)
    {
        m_iio = mraa_iio_init(device);
        if (m_iio == NULL) {
            std::ostringstream oss;
            oss << "IIO device " << device << " is not valid";
            throw std::invalid_argument(oss.str());
        }
    }